

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O1

int Psr_ManReadArguments(Psr_Man_t *p)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  Psr_Ntk_t *pPVar4;
  uint uVar5;
  int Entry;
  int iVar6;
  byte *pbVar7;
  ulong uVar8;
  uint uVar9;
  byte *pbVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Vec_Int_t *vSigsR [3];
  Vec_Int_t *vSigs [3];
  Vec_Int_t *local_68 [4];
  Vec_Int_t *local_48 [3];
  
  pPVar4 = p->pNtk;
  local_48[0] = &pPVar4->vInputs;
  local_48[1] = &pPVar4->vOutputs;
  local_48[2] = &pPVar4->vInouts;
  local_68[0] = &pPVar4->vInputsR;
  local_68[1] = &pPVar4->vOutputsR;
  local_68[2] = &pPVar4->vInoutsR;
  if (*p->pCur != '(') {
    __assert_fail("Psr_ManIsChar(p, \'(\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacReadVer.c"
                  ,0x293,"int Psr_ManReadArguments(Psr_Man_t *)");
  }
  pbVar7 = (byte *)(p->pCur + 1);
  p->pCur = (char *)pbVar7;
  pbVar10 = (byte *)p->pLimit;
  while (pbVar7 < pbVar10) {
    while( true ) {
      uVar8 = (ulong)*pbVar7;
      if (0x2f < uVar8) goto LAB_003c32af;
      if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) break;
      pbVar7 = pbVar7 + 1;
      p->pCur = (char *)pbVar7;
    }
    if (uVar8 != 0x2f) {
      if (uVar8 != 0) {
LAB_003c32af:
        pcVar1 = p->ErrorStr;
        uVar9 = 0xffffffff;
        Entry = 0;
        goto LAB_003c32c3;
      }
      break;
    }
    if (pbVar7[1] != 0x2a) {
      if (pbVar7[1] == 0x2f) {
        pbVar7 = pbVar7 + 2;
        p->pCur = (char *)pbVar7;
        if (pbVar7 < pbVar10) {
          while (*pbVar7 != 10) {
            pbVar7 = pbVar7 + 1;
            p->pCur = (char *)pbVar7;
            if (pbVar7 == pbVar10) goto LAB_003c32af;
          }
          pbVar7 = pbVar7 + 1;
          goto LAB_003c3245;
        }
      }
      goto LAB_003c32af;
    }
    pbVar7 = pbVar7 + 2;
    p->pCur = (char *)pbVar7;
    if (pbVar10 <= pbVar7) goto LAB_003c32af;
    while ((*pbVar7 != 0x2a || (pbVar7[1] != 0x2f))) {
      pbVar7 = pbVar7 + 1;
      p->pCur = (char *)pbVar7;
      if (pbVar7 == pbVar10) goto LAB_003c32af;
    }
    pbVar7 = pbVar7 + 2;
LAB_003c3245:
    p->pCur = (char *)pbVar7;
  }
  if (p->ErrorStr[0] == '\0') {
    builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
    if (p->ErrorStr[0] == '\0') {
      builtin_strncpy(p->ErrorStr,"Error number 30.",0x11);
      return 0;
    }
  }
LAB_003c380e:
  __assert_fail("!p->ErrorStr[0]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPrs.h"
                ,0x9d,"int Psr_ManErrorSet(Psr_Man_t *, char *, int)");
LAB_003c32c3:
  pbVar10 = (byte *)p->pCur;
  bVar2 = *pbVar10;
  if (bVar2 == 0x5c) {
    pbVar10 = pbVar10 + 1;
    pbVar7 = pbVar10;
    do {
      p->pCur = (char *)pbVar7;
      bVar2 = *pbVar7;
      pbVar7 = pbVar7 + 1;
    } while (bVar2 != 0x20);
LAB_003c331b:
    uVar5 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar10,p->pCur,(int *)0x0);
  }
  else if ((bVar2 == 0x5f) || (uVar5 = 0, 0xe5 < (byte)((bVar2 & 0xdf) + 0xa5))) {
    pbVar7 = pbVar10 + 1;
    do {
      do {
        p->pCur = (char *)pbVar7;
        bVar2 = *pbVar7;
        pbVar7 = pbVar7 + 1;
      } while (0xf5 < (byte)(bVar2 - 0x3a));
    } while (((bVar2 == 0x24) || (bVar2 == 0x5f)) || (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5)));
    goto LAB_003c331b;
  }
  if (uVar5 != 0) {
    pbVar10 = (byte *)p->pLimit;
    pbVar7 = (byte *)p->pCur;
    while (pbVar7 < pbVar10) {
      while( true ) {
        uVar8 = (ulong)*pbVar7;
        if (0x2f < uVar8) goto LAB_003c3456;
        if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) break;
        pbVar7 = pbVar7 + 1;
        p->pCur = (char *)pbVar7;
      }
      if (uVar8 != 0x2f) {
        if (uVar8 != 0) {
LAB_003c3456:
          if (3 < uVar5) goto LAB_003c3617;
          uVar9 = uVar5;
          if (*p->pCur != '[') goto LAB_003c359e;
          Entry = Psr_ManReadRange(p);
          if (Entry != 0) {
            pbVar10 = (byte *)p->pLimit;
            pbVar7 = (byte *)p->pCur;
            goto LAB_003c3488;
          }
          if (*pcVar1 != '\0') goto LAB_003c380e;
          builtin_strncpy(pcVar1,"Error number 33.",0x11);
          Entry = 0;
          goto LAB_003c3781;
        }
        break;
      }
      if (pbVar7[1] != 0x2a) {
        if (pbVar7[1] == 0x2f) {
          pbVar7 = pbVar7 + 2;
          p->pCur = (char *)pbVar7;
          if (pbVar7 < pbVar10) {
            while (*pbVar7 != 10) {
              pbVar7 = pbVar7 + 1;
              p->pCur = (char *)pbVar7;
              if (pbVar7 == pbVar10) goto LAB_003c3456;
            }
            pbVar7 = pbVar7 + 1;
            goto LAB_003c33dc;
          }
        }
        goto LAB_003c3456;
      }
      pbVar7 = pbVar7 + 2;
      p->pCur = (char *)pbVar7;
      if (pbVar10 <= pbVar7) goto LAB_003c3456;
      while ((*pbVar7 != 0x2a || (pbVar7[1] != 0x2f))) {
        pbVar7 = pbVar7 + 1;
        p->pCur = (char *)pbVar7;
        if (pbVar7 == pbVar10) goto LAB_003c3456;
      }
      pbVar7 = pbVar7 + 2;
LAB_003c33dc:
      p->pCur = (char *)pbVar7;
    }
    if (*pcVar1 == '\0') {
      builtin_strncpy(pcVar1,"Unexpectedly reached end-of-file.",0x22);
      if (*pcVar1 == '\0') {
        uVar11._0_1_ = ' ';
        uVar11._1_1_ = '3';
        uVar11._2_1_ = '2';
        uVar11._3_1_ = '.';
        goto LAB_003c343a;
      }
    }
    goto LAB_003c380e;
  }
  if (*pcVar1 != '\0') goto LAB_003c380e;
  uVar11._0_1_ = ' ';
  uVar11._1_1_ = '3';
  uVar11._2_1_ = '1';
  uVar11._3_1_ = '.';
LAB_003c343a:
  pcVar1[0] = 'E';
  pcVar1[1] = 'r';
  pcVar1[2] = 'r';
  pcVar1[3] = 'o';
  p->ErrorStr[4] = 'r';
  p->ErrorStr[5] = ' ';
  p->ErrorStr[6] = 'n';
  p->ErrorStr[7] = 'u';
  p->ErrorStr[8] = 'm';
  p->ErrorStr[9] = 'b';
  p->ErrorStr[10] = 'e';
  p->ErrorStr[0xb] = 'r';
  *(undefined4 *)(p->ErrorStr + 0xc) = uVar11;
  p->ErrorStr[0x10] = '\0';
LAB_003c3444:
  iVar6 = 1;
LAB_003c3449:
  if (iVar6 != 0) {
    if (iVar6 != 3) {
      return 0;
    }
    if (*p->pCur != ')') {
      __assert_fail("Psr_ManIsChar(p, \')\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacReadVer.c"
                    ,0x2b4,"int Psr_ManReadArguments(Psr_Man_t *)");
    }
    return 1;
  }
  goto LAB_003c32c3;
LAB_003c3488:
  if (pbVar10 <= pbVar7) goto LAB_003c355d;
  while( true ) {
    uVar8 = (ulong)*pbVar7;
    if (0x2f < uVar8) goto LAB_003c359e;
    if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) break;
    pbVar7 = pbVar7 + 1;
    p->pCur = (char *)pbVar7;
  }
  if (uVar8 != 0x2f) {
    if (uVar8 != 0) goto LAB_003c359e;
    goto LAB_003c355d;
  }
  if (pbVar7[1] == 0x2a) {
    pbVar7 = pbVar7 + 2;
    p->pCur = (char *)pbVar7;
    if (pbVar10 <= pbVar7) goto LAB_003c359e;
    while ((*pbVar7 != 0x2a || (pbVar7[1] != 0x2f))) {
      pbVar7 = pbVar7 + 1;
      p->pCur = (char *)pbVar7;
      if (pbVar7 == pbVar10) goto LAB_003c359e;
    }
    pbVar7 = pbVar7 + 2;
  }
  else {
    if (pbVar7[1] != 0x2f) goto LAB_003c359e;
    pbVar7 = pbVar7 + 2;
    p->pCur = (char *)pbVar7;
    if (pbVar10 <= pbVar7) goto LAB_003c359e;
    while (*pbVar7 != 10) {
      pbVar7 = pbVar7 + 1;
      p->pCur = (char *)pbVar7;
      if (pbVar7 == pbVar10) goto LAB_003c359e;
    }
    pbVar7 = pbVar7 + 1;
  }
  p->pCur = (char *)pbVar7;
  goto LAB_003c3488;
LAB_003c355d:
  if (*pcVar1 != '\0') goto LAB_003c380e;
  builtin_strncpy(pcVar1,"Unexpectedly reached end-of-file.",0x22);
  if (*pcVar1 != '\0') goto LAB_003c380e;
  uVar12._0_1_ = ' ';
  uVar12._1_1_ = '3';
  uVar12._2_1_ = '4';
  uVar12._3_1_ = '.';
LAB_003c3772:
  pcVar1[0] = 'E';
  pcVar1[1] = 'r';
  pcVar1[2] = 'r';
  pcVar1[3] = 'o';
  p->ErrorStr[4] = 'r';
  p->ErrorStr[5] = ' ';
  p->ErrorStr[6] = 'n';
  p->ErrorStr[7] = 'u';
  p->ErrorStr[8] = 'm';
  p->ErrorStr[9] = 'b';
  p->ErrorStr[10] = 'e';
  p->ErrorStr[0xb] = 'r';
  *(undefined4 *)(p->ErrorStr + 0xc) = uVar12;
  p->ErrorStr[0x10] = '\0';
LAB_003c3781:
  iVar6 = 1;
  goto LAB_003c3449;
LAB_003c359e:
  pbVar10 = (byte *)p->pCur;
  bVar2 = *pbVar10;
  if (bVar2 == 0x5c) {
    pbVar10 = pbVar10 + 1;
    pbVar7 = pbVar10;
    do {
      p->pCur = (char *)pbVar7;
      bVar2 = *pbVar7;
      pbVar7 = pbVar7 + 1;
    } while (bVar2 != 0x20);
LAB_003c35fa:
    uVar5 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar10,p->pCur,(int *)0x0);
  }
  else if ((bVar2 == 0x5f) || (uVar5 = 0, 0xe5 < (byte)((bVar2 & 0xdf) + 0xa5))) {
    pbVar7 = pbVar10 + 1;
    do {
      do {
        p->pCur = (char *)pbVar7;
        bVar2 = *pbVar7;
        pbVar7 = pbVar7 + 1;
      } while (0xf5 < (byte)(bVar2 - 0x3a));
    } while (((bVar2 == 0x24) || (bVar2 == 0x5f)) || (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5)));
    goto LAB_003c35fa;
  }
  if (uVar5 == 0) {
    if (*pcVar1 != '\0') goto LAB_003c380e;
    uVar12._0_1_ = ' ';
    uVar12._1_1_ = '3';
    uVar12._2_1_ = '5';
    uVar12._3_1_ = '.';
    goto LAB_003c3772;
  }
LAB_003c3617:
  if (0 < (int)uVar9) {
    Vec_IntPush(local_48[uVar9 - 1],uVar5);
    Vec_IntPush(local_68[uVar9 - 1],Entry);
    Vec_IntPush(&p->pNtk->vOrder,uVar9 + uVar5 * 4);
  }
  cVar3 = *p->pCur;
  if (cVar3 == ')') {
    iVar6 = 3;
    goto LAB_003c3449;
  }
  if (cVar3 == ',') {
    pbVar7 = (byte *)(p->pCur + 1);
    p->pCur = (char *)pbVar7;
    pbVar10 = (byte *)p->pLimit;
    while (pbVar7 < pbVar10) {
      while( true ) {
        uVar8 = (ulong)*pbVar7;
        iVar6 = 0;
        if (0x2f < uVar8) goto LAB_003c3449;
        if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) break;
        pbVar7 = pbVar7 + 1;
        p->pCur = (char *)pbVar7;
      }
      if (uVar8 != 0x2f) {
        if (uVar8 != 0) goto LAB_003c3449;
        break;
      }
      if (pbVar7[1] == 0x2a) {
        pbVar7 = pbVar7 + 2;
        p->pCur = (char *)pbVar7;
        if (pbVar10 <= pbVar7) goto LAB_003c3449;
        while ((*pbVar7 != 0x2a || (pbVar7[1] != 0x2f))) {
          pbVar7 = pbVar7 + 1;
          p->pCur = (char *)pbVar7;
          if (pbVar7 == pbVar10) goto LAB_003c3449;
        }
        pbVar7 = pbVar7 + 2;
      }
      else {
        if (pbVar7[1] != 0x2f) goto LAB_003c3449;
        pbVar7 = pbVar7 + 2;
        p->pCur = (char *)pbVar7;
        if (pbVar10 <= pbVar7) goto LAB_003c3449;
        while (*pbVar7 != 10) {
          pbVar7 = pbVar7 + 1;
          p->pCur = (char *)pbVar7;
          if (pbVar7 == pbVar10) goto LAB_003c3449;
        }
        pbVar7 = pbVar7 + 1;
      }
      p->pCur = (char *)pbVar7;
    }
    if (*pcVar1 != '\0') goto LAB_003c380e;
    builtin_strncpy(pcVar1,"Unexpectedly reached end-of-file.",0x22);
    if (*pcVar1 != '\0') goto LAB_003c380e;
    uVar11._0_1_ = ' ';
    uVar11._1_1_ = '3';
    uVar11._2_1_ = '6';
    uVar11._3_1_ = '.';
    goto LAB_003c343a;
  }
  if (*pcVar1 != '\0') goto LAB_003c380e;
  builtin_strncpy(pcVar1,"Expecting comma in the instance.",0x21);
  goto LAB_003c3444;
}

Assistant:

static inline int Psr_ManReadArguments( Psr_Man_t * p )
{
    int iRange = 0, iType = -1;
    Vec_Int_t * vSigs[3]  = { &p->pNtk->vInputs,  &p->pNtk->vOutputs,  &p->pNtk->vInouts  };
    Vec_Int_t * vSigsR[3] = { &p->pNtk->vInputsR, &p->pNtk->vOutputsR, &p->pNtk->vInoutsR };
    assert( Psr_ManIsChar(p, '(') );
    p->pCur++;
    if ( Psr_ManUtilSkipSpaces(p) )             return Psr_ManErrorSet(p, "Error number 30.", 0);
    while ( 1 )
    {
        int iName = Psr_ManReadName( p );
        if ( iName == 0 )                       return Psr_ManErrorSet(p, "Error number 31.", 0);
        if ( Psr_ManUtilSkipSpaces(p) )         return Psr_ManErrorSet(p, "Error number 32.", 0);
        if ( iName >= PRS_VER_INPUT && iName <= PRS_VER_INOUT ) // declaration
        {
            iType = iName;
            if ( Psr_ManIsChar(p, '[') )
            {
                iRange = Psr_ManReadRange(p);
                if ( iRange == 0 )              return Psr_ManErrorSet(p, "Error number 33.", 0);
                if ( Psr_ManUtilSkipSpaces(p) ) return Psr_ManErrorSet(p, "Error number 34.", 0);
            }
            iName = Psr_ManReadName( p );
            if ( iName == 0 )                   return Psr_ManErrorSet(p, "Error number 35.", 0);
        }
        if ( iType > 0 )
        {
            Vec_IntPush( vSigs[iType - PRS_VER_INPUT], iName );
            Vec_IntPush( vSigsR[iType - PRS_VER_INPUT], iRange );
            Vec_IntPush( &p->pNtk->vOrder, Abc_Var2Lit2(iName, iType) );
        }
        if ( Psr_ManIsChar(p, ')') )
            break;
        if ( !Psr_ManIsChar(p, ',') )           return Psr_ManErrorSet(p, "Expecting comma in the instance.", 0);
        p->pCur++;
        if ( Psr_ManUtilSkipSpaces(p) )         return Psr_ManErrorSet(p, "Error number 36.", 0);
    }
    // check final
    assert( Psr_ManIsChar(p, ')') );
    return 1;
}